

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bool __thiscall mp::internal::SolverAppOptionParser::ShowSolveResults(SolverAppOptionParser *this)

{
  bool bVar1;
  BasicSolver *this_00;
  CStringRef arg0;
  iterator this_01;
  iterator args_2;
  reference this_02;
  long in_RDI;
  RegEntry *sr;
  iterator __end2;
  iterator __begin2;
  SRRegMap *__range2;
  set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  *in_stack_ffffffffffffff88;
  RegEntry *in_stack_ffffffffffffff90;
  BasicCStringRef<char> in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  CStringRef in_stack_ffffffffffffffc0;
  BasicCStringRef<char> in_stack_fffffffffffffff0;
  
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xfffffffffffffff0,"Solve result table for {}\n");
  this_00 = (BasicSolver *)BasicSolver::long_name((BasicSolver *)0x6e4f2b);
  BasicSolver::Print<char_const*>
            ((BasicSolver *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffc0,(char **)in_stack_ffffffffffffffb0.data_);
  arg0.data_ = (char *)SolveResultRegistry::GetSolveResultRegistry
                                 ((SolveResultRegistry *)(*(long *)(in_RDI + 0x20) + 0x80));
  this_01 = std::
            set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
            ::begin(in_stack_ffffffffffffff88);
  args_2 = std::
           set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
           ::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    this_02 = std::_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry>::operator*
                        ((_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry> *)
                         in_stack_ffffffffffffff90);
    bVar1 = SolveResultRegistry::RegEntry::isSingle(in_stack_ffffffffffffff90);
    if (bVar1) {
      in_stack_ffffffffffffff90 = *(RegEntry **)(in_RDI + 0x20);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffc0,"\t    {:3}\t{}\n");
      SolveResultRegistry::RegEntry::first(this_02);
      SolveResultRegistry::RegEntry::descr_abi_cxx11_(this_02);
      BasicSolver::Print<int,std::__cxx11::string>
                ((BasicSolver *)this_01._M_node,arg0,(int *)args_2._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
    }
    else {
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffffb0,"\t{:3}-{:3}\t{}\n");
      SolveResultRegistry::RegEntry::first(this_02);
      SolveResultRegistry::RegEntry::last(this_02);
      SolveResultRegistry::RegEntry::descr_abi_cxx11_(this_02);
      BasicSolver::Print<int,int,std::__cxx11::string>
                (this_00,(CStringRef)in_stack_fffffffffffffff0.data_,(int *)arg0.data_,
                 (int *)this_01._M_node,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_2._M_node
                );
    }
    std::_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry>::operator++
              ((_Rb_tree_const_iterator<mp::SolveResultRegistry::RegEntry> *)
               in_stack_ffffffffffffff90);
  }
  return false;
}

Assistant:

bool SolverAppOptionParser::ShowSolveResults() {
  solver_.Print("Solve result table for {}\n", solver_.long_name());
  for (const auto& sr: solver_.GetSolveResultRegistry()) {
    if (sr.isSingle())
      solver_.Print("\t    {:3}\t{}\n", sr.first(), sr.descr());
    else     // range, printing as a header
      solver_.Print("\t{:3}-{:3}\t{}\n",
                    sr.first(), sr.last(), sr.descr());
  }
  return false;
}